

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

gs_val_t *
gs_c_fn_vec3_length(gs_val_t *__return_storage_ptr__,gs_eval_t *eval,gs_val_t *vals,int num_vals)

{
  float v;
  undefined1 local_40 [8];
  gs_val_t sig;
  gs_val_type local_20;
  int signature_arg_count;
  gs_val_type signature_arg_types [1];
  int num_vals_local;
  gs_val_t *vals_local;
  gs_eval_t *eval_local;
  
  local_20 = GS_VAL_VEC3;
  sig.field_2._12_4_ = 1;
  signature_arg_count = num_vals;
  _signature_arg_types = vals;
  gs_c_fn_signature((gs_val_t *)local_40,eval,vals,num_vals,&local_20,1);
  if ((local_40._4_4_ & 1) == 0) {
    v = vec3_length((_signature_arg_types->field_2).vec3_val);
    gs_val_float(__return_storage_ptr__,v);
  }
  else {
    __return_storage_ptr__->type = local_40._0_4_;
    __return_storage_ptr__->is_return = (_Bool)(char)local_40._4_4_;
    *(int3 *)&__return_storage_ptr__->field_0x5 = SUB43(local_40._4_4_,1);
    (__return_storage_ptr__->field_2).vec2_val = (vec2)sig._0_8_;
    *(vec2 *)((long)&__return_storage_ptr__->field_2 + 8) = sig.field_2.vec2_val;
  }
  return __return_storage_ptr__;
}

Assistant:

static gs_val_t gs_c_fn_vec3_length(gs_eval_t *eval, gs_val_t *vals, int num_vals) {
    gs_val_type signature_arg_types[] = { GS_VAL_VEC3 };
    int signature_arg_count = sizeof(signature_arg_types) / sizeof(signature_arg_types[0]);;
    gs_val_t sig = gs_c_fn_signature(eval, vals, num_vals, signature_arg_types, signature_arg_count);
    if (sig.is_return) return sig;

    return gs_val_float(vec3_length(vals[0].vec3_val));
}